

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosStream.cpp
# Opt level: O3

StepStatus __thiscall
adiosStream::readADIOS
          (adiosStream *this,CommandRead *cmdR,Config *cfg,Settings *settings,size_t step)

{
  undefined8 *puVar1;
  pointer psVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar4;
  char cVar5;
  uint uVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  ulong uVar9;
  long *plVar10;
  undefined8 *puVar11;
  ulong uVar12;
  ulong *puVar13;
  long *plVar14;
  pointer psVar15;
  char cVar16;
  undefined8 uVar17;
  uint uVar18;
  shared_ptr<VariableInfo> *v;
  ulong uVar19;
  bool bVar20;
  int totalRanks;
  Settings *local_1a0;
  int myRank;
  shared_ptr<VariableInfo> local_190;
  StepStatus local_17c;
  undefined8 *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string __str;
  vector<double,_std::allocator<double>_> readtime_all_ranks;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  varmap;
  _Rb_tree_node_base local_68;
  double local_40;
  double readTime;
  
  local_1a0 = settings;
  if ((settings->myRank == 0) && (settings->verbose != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    Read ",9);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(cmdR->streamName)._M_dataplus._M_p,
                        (cmdR->streamName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," with timeout value ",0x14);
    poVar7 = std::ostream::_M_insert<double>((double)cmdR->timeout_sec);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," using the group ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(cmdR->groupName)._M_dataplus._M_p,(cmdR->groupName)._M_string_length);
    if ((cmdR->variables).
        super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (cmdR->variables).
        super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," with selected variables:  ",0x1b);
      psVar2 = (cmdR->variables).
               super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar15 = (cmdR->variables).
                     super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar15 != psVar2;
          psVar15 = psVar15 + 1) {
        peVar3 = (psVar15->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(peVar3->name)._M_dataplus._M_p,
                            (peVar3->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  MPI_Barrier(this->comm);
  local_40 = (double)MPI_Wtime();
  local_17c = adios2::Engine::BeginStep((int)this + 0x30,cmdR->timeout_sec);
  if (local_17c == OK) {
    if (local_1a0->myRank == 0) {
      uVar18 = local_1a0->verbose;
      if (step == 1 && uVar18 != 0) {
        adios2::IO::AvailableVariables_abi_cxx11_(SUB81(&varmap,0));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    Variables in input for reading: ",0x24);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
        std::ostream::put('H');
        std::ostream::flush();
        p_Var8 = local_68._M_left;
        if (local_68._M_left != &local_68) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"        ",8);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,*(char **)(p_Var8 + 1),
                                (long)p_Var8[1]._M_parent);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
          } while (p_Var8 != &local_68);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                     *)&varmap);
        uVar18 = local_1a0->verbose;
        bVar20 = local_1a0->myRank != 0;
      }
      else {
        bVar20 = false;
      }
      if ((!bVar20) && (uVar18 != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    Read data ",0xe);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
        std::ostream::put('H');
        std::ostream::flush();
      }
    }
    psVar15 = (cmdR->variables).
              super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (cmdR->variables).
             super__Vector_base<std::shared_ptr<VariableInfo>,_std::allocator<std::shared_ptr<VariableInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar15 != psVar2) {
      do {
        local_190.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (psVar15->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this_00 = (psVar15->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_190.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          local_190.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               this_00;
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
              goto LAB_0011662c;
            }
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
LAB_0011662c:
        getADIOSArray(this,&local_190);
        if (local_190.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_190.super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        psVar15 = psVar15 + 1;
      } while (psVar15 != psVar2);
    }
    if ((step == 1) && (local_1a0->fixedPattern == true)) {
      if ((local_1a0->myRank == 0) && (local_1a0->verbose != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "        Lock Reader Selections for Fixed Pattern before first EndStep",0x45);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
        std::ostream::put('H');
        std::ostream::flush();
      }
      adios2::Engine::LockWriterDefinitions();
    }
    adios2::Engine::EndStep();
    local_1a0 = (Settings *)MPI_Wtime();
    MPI_Comm_rank(this->comm,&myRank);
    MPI_Comm_size(this->comm,&totalRanks);
    if (this->hasIOTimer == true) {
      readTime = (double)local_1a0 - local_40;
      readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (myRank == 0) {
        std::vector<double,_std::allocator<double>_>::reserve(&readtime_all_ranks,(long)totalRanks);
      }
      MPI_Gather(&readTime,1,&ompi_mpi_double,
                 readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,1,&ompi_mpi_double,0,this->comm);
      if ((myRank == 0) && (0 < totalRanks)) {
        uVar19 = 0;
        do {
          uVar9 = adios2::Engine::CurrentStep();
          cVar16 = '\x01';
          if (9 < uVar9) {
            uVar12 = uVar9;
            cVar5 = '\x04';
            do {
              cVar16 = cVar5;
              if (uVar12 < 100) {
                cVar16 = cVar16 + -2;
                goto LAB_00116827;
              }
              if (uVar12 < 1000) {
                cVar16 = cVar16 + -1;
                goto LAB_00116827;
              }
              if (uVar12 < 10000) goto LAB_00116827;
              bVar20 = 99999 < uVar12;
              uVar12 = uVar12 / 10000;
              cVar5 = cVar16 + '\x04';
            } while (bVar20);
            cVar16 = cVar16 + '\x01';
          }
LAB_00116827:
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          std::__cxx11::string::_M_construct((ulong)&__str,cVar16);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar9);
          plVar10 = (long *)std::__cxx11::string::append((char *)&__str);
          local_138 = &local_128;
          puVar13 = (ulong *)(plVar10 + 2);
          if ((ulong *)*plVar10 == puVar13) {
            local_128 = *puVar13;
            lStack_120 = plVar10[3];
          }
          else {
            local_128 = *puVar13;
            local_138 = (ulong *)*plVar10;
          }
          local_130 = plVar10[1];
          *plVar10 = (long)puVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          uVar18 = 1;
          if (9 < uVar19) {
            uVar4 = 4;
            uVar9 = uVar19;
            do {
              uVar18 = uVar4;
              uVar6 = (uint)uVar9;
              if (uVar6 < 100) {
                uVar18 = uVar18 - 2;
                goto LAB_00116907;
              }
              if (uVar6 < 1000) {
                uVar18 = uVar18 - 1;
                goto LAB_00116907;
              }
              if (uVar6 < 10000) goto LAB_00116907;
              uVar9 = (uVar9 & 0xffffffff) / 10000;
              uVar4 = uVar18 + 4;
            } while (99999 < uVar6);
            uVar18 = uVar18 + 1;
          }
LAB_00116907:
          __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
          std::__cxx11::string::_M_construct((ulong)&__str_1,(char)uVar18);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (__str_1._M_dataplus._M_p,uVar18,(uint)uVar19);
          uVar9 = 0xf;
          if (local_138 != &local_128) {
            uVar9 = local_128;
          }
          if (uVar9 < __str_1._M_string_length + local_130) {
            uVar17 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
              uVar17 = __str_1.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < __str_1._M_string_length + local_130) goto LAB_001169a3;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,(ulong)local_138);
          }
          else {
LAB_001169a3:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_138,(ulong)__str_1._M_dataplus._M_p);
          }
          local_178 = &local_168;
          puVar1 = puVar11 + 2;
          if ((undefined8 *)*puVar11 == puVar1) {
            local_168 = *puVar1;
            uStack_160 = puVar11[3];
          }
          else {
            local_168 = *puVar1;
            local_178 = (undefined8 *)*puVar11;
          }
          local_170 = puVar11[1];
          *puVar11 = puVar1;
          puVar11[1] = 0;
          *(undefined1 *)puVar1 = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_178);
          local_118 = &local_108;
          puVar13 = (ulong *)(plVar10 + 2);
          if ((ulong *)*plVar10 == puVar13) {
            local_108 = *puVar13;
            lStack_100 = plVar10[3];
          }
          else {
            local_108 = *puVar13;
            local_118 = (ulong *)*plVar10;
          }
          local_110 = plVar10[1];
          *plVar10 = (long)puVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_c8,vsnprintf,0x148,"%f",
                     SUB84(readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar19],0));
          uVar9 = 0xf;
          if (local_118 != &local_108) {
            uVar9 = local_108;
          }
          if (uVar9 < local_c8._M_string_length + local_110) {
            uVar17 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              uVar17 = local_c8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < local_c8._M_string_length + local_110) goto LAB_00116b04;
            puVar11 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_118)
            ;
          }
          else {
LAB_00116b04:
            puVar11 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_118,(ulong)local_c8._M_dataplus._M_p);
          }
          local_158 = &local_148;
          puVar1 = puVar11 + 2;
          if ((undefined8 *)*puVar11 == puVar1) {
            local_148 = *puVar1;
            uStack_140 = puVar11[3];
          }
          else {
            local_148 = *puVar1;
            local_158 = (undefined8 *)*puVar11;
          }
          local_150 = puVar11[1];
          *puVar11 = puVar1;
          puVar11[1] = 0;
          *(undefined1 *)puVar1 = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_158);
          _varmap = &local_68._M_parent;
          plVar14 = plVar10 + 2;
          if ((_Base_ptr *)*plVar10 == (_Base_ptr *)plVar14) {
            local_68._M_parent = (_Base_ptr)*plVar14;
            local_68._M_left = (_Base_ptr)plVar10[3];
          }
          else {
            local_68._M_parent = (_Base_ptr)*plVar14;
            _varmap = (_Base_ptr *)*plVar10;
          }
          local_68._0_8_ = plVar10[1];
          *plVar10 = (long)plVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          if (local_158 != &local_148) {
            operator_delete(local_158);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if (local_118 != &local_108) {
            operator_delete(local_118);
          }
          if (local_178 != &local_168) {
            operator_delete(local_178);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
            operator_delete(__str_1._M_dataplus._M_p);
          }
          if (local_138 != &local_128) {
            operator_delete(local_138);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
          }
          fputs((char *)_varmap,(FILE *)this->perfLogFP);
          if (_varmap != &local_68._M_parent) {
            operator_delete(_varmap);
          }
          uVar19 = uVar19 + 1;
        } while ((long)uVar19 < (long)totalRanks);
      }
      if (readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(readtime_all_ranks.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return local_17c;
}

Assistant:

adios2::StepStatus adiosStream::readADIOS(CommandRead *cmdR, Config &cfg, const Settings &settings,
                                          size_t step)
{
    if (!settings.myRank && settings.verbose)
    {
        std::cout << "    Read " << cmdR->streamName << " with timeout value " << cmdR->timeout_sec
                  << " using the group " << cmdR->groupName;
        if (!cmdR->variables.empty())
        {
            std::cout << " with selected variables:  ";
            for (const auto &v : cmdR->variables)
            {
                std::cout << v->name << " ";
            }
        }
        std::cout << "... " << std::endl;
    }
    double timeStart, timeEnd;
    double readTime;
    // double maxReadTime, minReadTime;
    MPI_Barrier(comm);
    timeStart = MPI_Wtime();
    adios2::StepStatus status = engine.BeginStep(cmdR->stepMode, cmdR->timeout_sec);
    if (status != adios2::StepStatus::OK)
    {
        return status;
    }

    if (!settings.myRank && settings.verbose && step == 1)
    {
        const auto varmap = io.AvailableVariables();
        std::cout << "    Variables in input for reading: " << std::endl;
        for (const auto &v : varmap)
        {
            std::cout << "        " << v.first << std::endl;
        }
    }

    if (!settings.myRank && settings.verbose)
    {
        std::cout << "    Read data " << std::endl;
    }

    for (auto ov : cmdR->variables)
    {
        getADIOSArray(ov);
    }

    if (step == 1 && settings.fixedPattern)
    {
        if (!settings.myRank && settings.verbose)
        {
            std::cout << "        Lock Reader Selections for Fixed Pattern before "
                         "first EndStep"
                      << std::endl;
        }
        engine.LockWriterDefinitions();
    }

    engine.EndStep();
    timeEnd = MPI_Wtime();
    int myRank, totalRanks;
    MPI_Comm_rank(comm, &myRank);
    MPI_Comm_size(comm, &totalRanks);
    if (hasIOTimer)
    {
        readTime = timeEnd - timeStart;
        // double *writetime_all_ranks = NULL;
        std::vector<double> readtime_all_ranks;
        if (myRank == 0)
        {
            // writetime_all_ranks = (double *)malloc(totalRanks);
            //	if (!writetime_all_ranks)
            //	{
            //	    std::cout << "rank " << myRank << ": malloc failed!" <<
            // std::endl;
            //	}
            //	else
            //	{
            //	    std::cout << "rank " << myRank << ": malloc succeeded!" <<
            // std::endl;
            //	}
            readtime_all_ranks.reserve(totalRanks);
        }

        MPI_Gather(&readTime, 1, MPI_DOUBLE, readtime_all_ranks.data(), 1, MPI_DOUBLE, 0, comm);
        if (myRank == 0)
        {
            for (int i = 0; i < totalRanks; i++)
            {
                std::string content = std::to_string(engine.CurrentStep()) + "," +
                                      std::to_string(i) + ",read," +
                                      std::to_string(readtime_all_ranks[i]) + "\n";
                // std::cout << content;
                fputs(content.c_str(), perfLogFP);
            }
        }
    }

    // for (auto ov : cmdR->variables)
    // {
    //     if (settings.myRank == 1)
    //     {
    //         size_t varsize = std::accumulate(ov->count.begin(),
    //         ov->count.end(), 1,
    //                             std::multiplies<std::size_t>());
    //         std::cout << ov->name << ", " << varsize << std::endl;
    //         const double *dd = reinterpret_cast<double *>(ov->data.data());
    //         for (int j = 0; j < varsize; j++)
    //             std::cout << dd[j] << ", ";
    //         std::cout << std::endl;
    //     }
    // }
    return status;
}